

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall wasm::EffectAnalyzer::walk(EffectAnalyzer *this,Function *func)

{
  Function *func_local;
  EffectAnalyzer *this_local;
  
  walk(this,func->body);
  if ((this->hasReturnCallThrow & 1U) != 0) {
    this->throws_ = true;
  }
  this->branchesOut = false;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
            (&this->localsWritten);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
            (&this->localsRead);
  return;
}

Assistant:

void walk(Function* func) {
    walk(func->body);

    // Effects of return-called functions will be visible to the caller.
    if (hasReturnCallThrow) {
      throws_ = true;
    }

    // We can ignore branching out of the function body - this can only be
    // a return, and that is only noticeable in the function, not outside.
    branchesOut = false;

    // When the function exits, changes to locals cannot be noticed any more.
    localsWritten.clear();
    localsRead.clear();
  }